

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O1

void bson_iter_document(bson_iter_t *iter,uint32_t *document_len,uint8_t **document)

{
  uint8_t *puVar1;
  long *extraout_RDX;
  char *extraout_RDX_00;
  char *unaff_RBX;
  uint unaff_EBP;
  bson_iter_t *unaff_R14;
  
  if (iter == (bson_iter_t *)0x0) {
    bson_iter_document_cold_3();
LAB_00110793:
    bson_iter_document_cold_2();
  }
  else {
    if (document_len == (uint32_t *)0x0) goto LAB_00110793;
    if (document != (uint8_t **)0x0) {
      *document = (uint8_t *)0x0;
      *document_len = 0;
      if (iter->raw[iter->type] == '\x03') {
        *document_len = *(uint32_t *)(iter->raw + iter->d1);
        *document = iter->raw + iter->d1;
      }
      return;
    }
  }
  bson_iter_document_cold_1();
  if (iter == (bson_iter_t *)0x0) {
    bson_iter_array_cold_3();
LAB_001107de:
    bson_iter_array_cold_2();
  }
  else {
    if ((bson_t *)document_len == (bson_t *)0x0) goto LAB_001107de;
    if (extraout_RDX != (long *)0x0) {
      *extraout_RDX = 0;
      ((bson_t *)document_len)->flags = 0;
      if (iter->raw[iter->type] == '\x04') {
        ((bson_t *)document_len)->flags = *(uint32_t *)(iter->raw + iter->d1);
        *extraout_RDX = (long)(iter->raw + iter->d1);
      }
      return;
    }
  }
  bson_iter_array_cold_1();
  if (iter == (bson_iter_t *)0x0) {
    bson_iter_init_find_cold_3();
LAB_00110869:
    bson_iter_init_find_cold_2();
LAB_0011086e:
    bson_iter_init_find_cold_1();
  }
  else {
    if ((bson_t *)document_len == (bson_t *)0x0) goto LAB_00110869;
    unaff_RBX = extraout_RDX_00;
    if (extraout_RDX_00 == (char *)0x0) goto LAB_0011086e;
    unaff_EBP = ((bson_t *)document_len)->len;
    unaff_R14 = iter;
    if (4 < unaff_EBP) {
      puVar1 = bson_get_data((bson_t *)document_len);
      iter->raw = puVar1;
      iter->len = ((bson_t *)document_len)->len;
      iter->d1 = 0;
      iter->d2 = 0;
      iter->d3 = 0;
      iter->d4 = 0;
      iter->off = 0;
      iter->type = 0;
      iter->key = 0;
      iter->d1 = 0;
      iter->next_off = 4;
      iter->err_off = 0;
      goto LAB_00110838;
    }
  }
  (unaff_R14->value).value.v_regex.options = (char *)0x0;
  *(undefined8 *)((long)&(unaff_R14->value).value + 0x10) = 0;
  (unaff_R14->value).value_type = BSON_TYPE_EOD;
  (unaff_R14->value).padding = 0;
  (unaff_R14->value).value.v_int64 = 0;
  unaff_R14->d3 = 0;
  unaff_R14->d4 = 0;
  unaff_R14->next_off = 0;
  unaff_R14->err_off = 0;
  unaff_R14->type = 0;
  unaff_R14->key = 0;
  unaff_R14->d1 = 0;
  unaff_R14->d2 = 0;
  unaff_R14->raw = (uint8_t *)0x0;
  unaff_R14->len = 0;
  unaff_R14->off = 0;
LAB_00110838:
  if (4 < unaff_EBP) {
    _bson_iter_find_with_len(unaff_R14,unaff_RBX,-1);
    return;
  }
  return;
}

Assistant:

void
bson_iter_document (const bson_iter_t *iter,  /* IN */
                    uint32_t *document_len,   /* OUT */
                    const uint8_t **document) /* OUT */
{
   BSON_ASSERT (iter);
   BSON_ASSERT (document_len);
   BSON_ASSERT (document);

   *document = NULL;
   *document_len = 0;

   if (ITER_TYPE (iter) == BSON_TYPE_DOCUMENT) {
      memcpy (document_len, (iter->raw + iter->d1), sizeof (*document_len));
      *document_len = BSON_UINT32_FROM_LE (*document_len);
      *document = (iter->raw + iter->d1);
   }
}